

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.hpp
# Opt level: O2

Server * __thiscall ws::Server::run(Server *this)

{
  Server *this_00;
  allocator<char> local_91;
  TaskQueue *local_90;
  FormatWithLoc local_88;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_90 = std::function<httplib::TaskQueue_*()>::operator()(&this->new_task_queue);
  if (this->inited == false) {
    std::__cxx11::string::string
              ((string *)&local_88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               no_fmt_abi_cxx11_);
    local_88.loc._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195760;
    critical<char_const(&)[12]>(&local_88,(char (*) [12])"Not inited.");
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"/",&local_91);
  this_00 = &this->svr;
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/include/wxserver/server.hpp:182:15)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/include/wxserver/server.hpp:182:15)>
             ::_M_manager;
  local_40._M_unused._M_object = this;
  httplib::Server::Get(this_00,&local_88.fmt,(Handler *)&local_40);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"/",&local_91);
  local_60._8_8_ = &local_90;
  local_48 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/include/wxserver/server.hpp:193:16)>
             ::_M_invoke;
  local_50 = std::
             _Function_handler<void_(const_httplib::Request_&,_httplib::Response_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/caozhanhao[P]wxserver/include/wxserver/server.hpp:193:16)>
             ::_M_manager;
  local_60._M_unused._M_object = this;
  httplib::Server::Post(this_00,&local_88.fmt,(Handler *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string
            ((string *)&local_88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)no_fmt_abi_cxx11_)
  ;
  local_88.loc._M_impl = (__impl *)&PTR_s__workspace_llm4binary_github_lic_00195778;
  info<char_const(&)[23],std::__cxx11::string&,char_const(&)[9],int&>
            (&local_88,(char (*) [23])"Server started. Host: ",&this->host,(char (*) [9])", Port: ",
             &this->port);
  std::__cxx11::string::~string((string *)&local_88);
  httplib::Server::listen(this_00,(int)&this->host,this->port);
  (*local_90->_vptr_TaskQueue[3])();
  if (local_90 != (TaskQueue *)0x0) {
    (*local_90->_vptr_TaskQueue[1])();
  }
  return this;
}

Assistant:

Server &run()
    {
      std::unique_ptr<httplib::TaskQueue> task_queue(new_task_queue());
      if (!inited)
      {
        critical(no_fmt, "Not inited.");
      }
      svr.Get("/",
              [this](const httplib::Request &req, httplib::Response &res)
              {
                auto msg_sig = req.get_param_value("msg_signature");
                auto timestamp = req.get_param_value("timestamp");
                auto nonce = req.get_param_value("nonce");
                auto req_echostr = req.get_param_value("echostr");
                auto echostr = crypto.verify_url(msg_sig, timestamp, nonce, req_echostr);
                res.set_content(echostr, "text/plain");
                info(no_fmt, "Verify url successfully.");
              });
      svr.Post("/",
               [this, &task_queue](const httplib::Request &req, httplib::Response &res)
               {
                 auto a = req.body.find("<xml>");
                 auto b = req.body.find("</xml>");
                 auto req_xml = req.body.substr(a, b + 6);
  
                 auto msg_encrypt = details::xml_parse(req_xml, "Encrypt");
                 std::string plain_xml;
                 try
                 {
                   plain_xml = crypto.decrypt_msg(req.get_param_value("msg_signature"),
                                                  req.get_param_value("timestamp"),
                                                  req.get_param_value("nonce"),
                                                  details::xml_parse(req_xml, "Encrypt"));
                 }
                 catch (MsgCryptoError &err)
                 {
                   error(FormatWithLoc(no_fmt, err.location), err.what());
                   return;
                 }
  
                 Request wxreq;
  
                 wxreq.content = details::xml_parse(plain_xml, "Content");
                 wxreq.user_id = details::xml_parse(plain_xml, "FromUserName");
                 if (auto type = details::xml_parse(plain_xml, "MsgType"); type == "text")
                 {
                   wxreq.msg_type = Request::MsgType::text;
                 }
                 else
                 {
                   wxreq.msg_type = Request::MsgType::unknown;
                 }
  
                 info(no_fmt, "From: ", wxreq.user_id, " | Content: ", wxreq.content);
  
                 if (msg_handle)
                 {
                   task_queue->enqueue([this, wxreq]()
                                       {
                                         Message wxres;
                                         msg_handle(wxreq, wxres);
                                         if (wxres.to_user.empty())
                                         {
                                           wxres.set_user(wxreq.user_id);
                                         }
                                         send_message(wxres);
                                       });
                 }
               });
      info(no_fmt, "Server started. Host: ", host, ", Port: ", port);
      svr.listen(host, port);
      task_queue->shutdown();
      return *this;
    }